

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::auxBranchActiveLoss(Graph *this,Vertex *no,double *soma)

{
  Edge **ppEVar1;
  Edge *pEVar2;
  double dVar3;
  
  ppEVar1 = &no->edgesList;
  do {
    pEVar2 = *ppEVar1;
    if (pEVar2 == (Edge *)0x0) {
      return;
    }
    while( true ) {
      if (pEVar2 == (Edge *)0x0) {
        return;
      }
      if (pEVar2->closed != false) break;
      pEVar2->activePowerFlow = 0.0;
      pEVar2->reactivePowerFlow = 0.0;
      pEVar2->activeLoss = 0.0;
      pEVar2->reactiveLoss = 0.0;
      pEVar2 = pEVar2->nextEdge;
    }
    dVar3 = Vertex::getActivePower(pEVar2->destiny);
    *soma = dVar3 + pEVar2->activeLoss + *soma;
    auxBranchActiveLoss(this,pEVar2->destiny,soma);
    ppEVar1 = &pEVar2->nextEdge;
  } while( true );
}

Assistant:

void Graph::auxBranchActiveLoss(Vertex *no, double &soma){
    for(Edge *a= no->getEdgesList(); a != NULL; a= a->getNext()){

        //nao descer por arcos com chave aberta
        while(a!=NULL && a->isClosed() == false){

            //nao tem fluxo nem perda em arcos abertos
            a->setActiveFlow(0.0);
            a->setReactiveFlow(0.0);
            a->setActiveLoss(0.0);
            a->setReactiveLoss(0.0);

            a = a->getNext();
        }
        if(a==NULL)
            break;

        soma+= a->getDestiny()->getActivePower() + a->getActiveLoss();
        auxBranchActiveLoss(a->getDestiny(), soma);
    }
}